

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O1

void __thiscall glcts::TextureBufferOperations::deinit(TextureBufferOperations *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  (**(code **)(lVar2 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  if (this->m_texbuff_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texbuff_id);
    this->m_texbuff_id = 0;
  }
  if (this->m_tb_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_tb_bo_id);
    this->m_tb_bo_id = 0;
  }
  deinitFirstPhase(this);
  deinitSecondPhase(this);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferOperations::deinit(void)
{
	/* Get GLES entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);
	gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);

	/* Delete GLES objects */
	if (0 != m_texbuff_id)
	{
		gl.deleteTextures(1, &m_texbuff_id);
		m_texbuff_id = 0;
	}

	if (0 != m_tb_bo_id)
	{
		gl.deleteBuffers(1, &m_tb_bo_id);
		m_tb_bo_id = 0;
	}

	deinitFirstPhase();
	deinitSecondPhase();

	/* Deinitialize base class */
	TestCaseBase::deinit();
}